

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O3

void __thiscall
TPZEqnArray<double>::EqnBackward(TPZEqnArray<double> *this,TPZFMatrix<double> *U,DecomposeType dec)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  
  if (this->fSymmetric == EIsNonSymmetric) {
    if (1 < (long)this->fNumEq) {
      lVar7 = (long)this->fNumEq;
      do {
        piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
        iVar1 = piVar3[lVar7 + -2];
        lVar6 = (long)iVar1;
        iVar2 = piVar3[lVar7 + -1];
        dVar10 = 0.0;
        if (iVar1 + 1 < iVar2) {
          lVar9 = lVar6;
          do {
            lVar8 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                          [lVar9 + 1];
            if (((lVar8 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
               ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dVar10 = dVar10 - U->fElem[lVar8] *
                              (this->fEqValues).super_TPZManVector<double,_1000>.
                              super_TPZVec<double>.fStore[lVar9 + 1];
            lVar9 = lVar9 + 1;
          } while (iVar2 + -1 != (int)lVar9);
        }
        lVar9 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar6];
        if (((lVar9 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
           ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar4 = U->fElem;
        pdVar4[lVar9] = dVar10 + pdVar4[lVar9];
        if ((dec & ~ELUPivot) == ELU) {
          lVar9 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar6]
          ;
          if (((lVar9 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
             ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          pdVar4[lVar9] =
               pdVar4[lVar9] /
               (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>.fStore[lVar6]
          ;
        }
        bVar5 = 3 < lVar7;
        lVar7 = lVar7 + -2;
      } while (bVar5);
    }
  }
  else if ((this->fSymmetric == EIsSymmetric) &&
          (lVar7 = (long)this->fNumEq, 0 < (long)this->fNumEq)) {
    do {
      piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      iVar1 = piVar3[lVar7 + -1];
      lVar6 = (long)iVar1;
      iVar2 = piVar3[lVar7];
      dVar10 = 0.0;
      if (iVar1 + 1 < iVar2) {
        lVar9 = lVar6;
        do {
          lVar8 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore
                        [lVar9 + 1];
          if (((lVar8 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar8)) ||
             ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar10 = dVar10 - U->fElem[lVar8] *
                            (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>.
                            fStore[lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while (iVar2 + -1 != (int)lVar9);
      }
      lVar9 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar6];
      if (((lVar9 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
         ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4 = U->fElem;
      pdVar4[lVar9] = dVar10 + pdVar4[lVar9];
      if (dec == ECholesky) {
        lVar9 = (long)(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.fStore[lVar6];
        if (((lVar9 < 0) || ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar9)) ||
           ((U->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar4[lVar9] =
             pdVar4[lVar9] /
             (this->fEqValues).super_TPZManVector<double,_1000>.super_TPZVec<double>.fStore[lVar6];
      }
      bVar5 = 1 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar5);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}